

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O2

int __thiscall ncnn::InnerProduct_x86_fma::create_pipeline(InnerProduct_x86_fma *this,Option *opt)

{
  Mat *this_00;
  undefined4 *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint _h;
  int *piVar14;
  void *pvVar15;
  Allocator *pAVar16;
  size_t sVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  int iVar22;
  int iVar23;
  int iVar24;
  Layer *pLVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  undefined4 *puVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  long local_e8;
  ParamDict pd;
  size_t local_d0;
  Allocator *local_c0;
  int local_b4;
  
  pLVar25 = create_layer_cpu(0xe);
  this->flatten = pLVar25;
  ParamDict::ParamDict(&pd);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&pd);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict(&pd);
  if ((opt->use_int8_inference == true) && ((this->super_InnerProduct).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  iVar23 = cpu_support_x86_f16c();
  if ((iVar23 != 0) && (opt->use_fp16_storage == true)) {
    create_pipeline_fp16s(this,opt);
    return 0;
  }
  iVar23 = (this->super_InnerProduct).weight_data_size;
  _h = (this->super_InnerProduct).num_output;
  uVar38 = (ulong)(int)_h;
  iVar24 = iVar23 / (int)_h;
  this_00 = &(this->super_InnerProduct).weight_data;
  if (opt->use_packing_layout == true) {
    if ((uVar38 & 7) == 0) {
      Mat::reshape((Mat *)&pd,this_00,iVar24,_h,(Allocator *)0x0);
      Mat::create(&this->weight_data_tm,iVar24,(int)_h >> 3,0x20,8,(Allocator *)0x0);
      lVar26 = 3;
      lVar37 = 4;
      lVar29 = 5;
      lVar27 = 6;
      lVar28 = 7;
      lVar35 = 2;
      lVar32 = 1;
      local_e8 = 0;
      for (uVar30 = 0; (long)(uVar30 | 7) < (long)uVar38; uVar30 = uVar30 + 8) {
        lVar33 = (long)(this->weight_data_tm).w;
        pvVar15 = (this->weight_data_tm).data;
        sVar17 = (this->weight_data_tm).elemsize;
        puVar31 = (undefined4 *)((uVar30 >> 3) * lVar33 * sVar17 + (long)pvVar15);
        lVar34 = (long)local_b4;
        lVar33 = sVar17 * local_e8 * lVar33;
        lVar39 = 0;
        lVar36 = 0;
        for (iVar23 = 0; iVar23 + 7 < iVar24; iVar23 = iVar23 + 8) {
          auVar6 = *(undefined1 (*) [32])
                    ((long)pd._vptr_ParamDict + lVar36 + local_d0 * uVar30 * lVar34);
          auVar7 = *(undefined1 (*) [32])
                    ((long)pd._vptr_ParamDict + lVar36 + local_d0 * lVar32 * lVar34);
          auVar8 = *(undefined1 (*) [32])
                    ((long)pd._vptr_ParamDict + lVar36 + local_d0 * lVar35 * lVar34);
          auVar9 = *(undefined1 (*) [32])
                    ((long)pd._vptr_ParamDict + lVar36 + local_d0 * lVar26 * lVar34);
          auVar10 = *(undefined1 (*) [32])
                     ((long)pd._vptr_ParamDict + lVar36 + local_d0 * lVar37 * lVar34);
          auVar11 = *(undefined1 (*) [32])
                     ((long)pd._vptr_ParamDict + lVar36 + local_d0 * lVar29 * lVar34);
          auVar12 = *(undefined1 (*) [32])
                     ((long)pd._vptr_ParamDict + lVar36 + local_d0 * lVar27 * lVar34);
          auVar13 = *(undefined1 (*) [32])
                     ((long)pd._vptr_ParamDict + lVar36 + local_d0 * lVar28 * lVar34);
          auVar21 = vunpcklps_avx(auVar6,auVar7);
          auVar7 = vunpckhps_avx(auVar6,auVar7);
          auVar6 = vunpcklps_avx(auVar8,auVar9);
          auVar8 = vunpckhps_avx(auVar8,auVar9);
          auVar40 = vunpcklps_avx(auVar10,auVar11);
          auVar9 = vunpckhps_avx(auVar10,auVar11);
          auVar41 = vunpcklps_avx(auVar12,auVar13);
          auVar10 = vunpckhps_avx(auVar12,auVar13);
          auVar11 = vunpcklpd_avx(auVar21,auVar6);
          auVar6 = vunpckhpd_avx(auVar21,auVar6);
          auVar12 = vunpcklpd_avx(auVar7,auVar8);
          auVar7 = vunpckhpd_avx(auVar7,auVar8);
          auVar13 = vunpcklpd_avx(auVar40,auVar41);
          auVar8 = vunpckhpd_avx(auVar40,auVar41);
          auVar21 = vunpcklpd_avx(auVar9,auVar10);
          auVar9 = vunpckhpd_avx(auVar9,auVar10);
          auVar40._16_16_ = auVar13._0_16_;
          auVar40._0_16_ = auVar11._0_16_;
          auVar41._16_16_ = auVar8._0_16_;
          auVar41._0_16_ = auVar6._0_16_;
          auVar42._16_16_ = auVar21._0_16_;
          auVar42._0_16_ = auVar12._0_16_;
          auVar43._16_16_ = auVar9._0_16_;
          auVar43._0_16_ = auVar7._0_16_;
          auVar10 = vperm2f128_avx(auVar11,auVar13,0x31);
          auVar6 = vperm2f128_avx(auVar6,auVar8,0x31);
          auVar8 = vperm2f128_avx(auVar12,auVar21,0x31);
          auVar7 = vperm2f128_avx(auVar7,auVar9,0x31);
          *(undefined1 (*) [32])((long)pvVar15 + lVar36 * 8 + lVar33) = auVar40;
          *(undefined1 (*) [32])((long)pvVar15 + lVar36 * 8 + lVar33 + 0x20) = auVar41;
          *(undefined1 (*) [32])((long)pvVar15 + lVar36 * 8 + lVar33 + 0x40) = auVar42;
          *(undefined1 (*) [32])((long)pvVar15 + lVar36 * 8 + lVar33 + 0x60) = auVar43;
          *(undefined1 (*) [32])((long)pvVar15 + lVar36 * 8 + lVar33 + 0x80) = auVar10;
          *(undefined1 (*) [32])((long)pvVar15 + lVar36 * 8 + lVar33 + 0xa0) = auVar6;
          *(undefined1 (*) [32])((long)pvVar15 + lVar36 * 8 + lVar33 + 0xc0) = auVar8;
          *(undefined1 (*) [32])((long)pvVar15 + lVar36 * 8 + lVar33 + 0xe0) = auVar7;
          puVar31 = puVar31 + 0x40;
          lVar36 = lVar36 + 0x20;
          lVar39 = lVar39 + 8;
        }
        lVar34 = local_d0 * lVar34;
        for (; (int)lVar39 < iVar24; lVar39 = lVar39 + 1) {
          puVar1 = (undefined4 *)((long)pd._vptr_ParamDict + lVar39 * 4 + lVar34 * uVar30);
          *puVar31 = *puVar1;
          puVar31[1] = *(undefined4 *)((long)puVar1 + lVar34);
          puVar31[2] = *(undefined4 *)((long)puVar1 + lVar34 * 2);
          puVar31[3] = *(undefined4 *)((long)puVar1 + lVar34 * 3);
          puVar31[4] = puVar1[lVar34];
          puVar31[5] = *(undefined4 *)((long)puVar1 + lVar34 * 5);
          puVar31[6] = *(undefined4 *)((long)puVar1 + lVar34 * 6);
          puVar31[7] = *(undefined4 *)((long)puVar1 + lVar34 * 7);
          puVar31 = puVar31 + 8;
        }
        lVar26 = lVar26 + 8;
        lVar37 = lVar37 + 8;
        lVar29 = lVar29 + 8;
        lVar27 = lVar27 + 8;
        lVar28 = lVar28 + 8;
        lVar35 = lVar35 + 8;
        lVar32 = lVar32 + 8;
        local_e8 = local_e8 + 1;
      }
      if (pd.d == (ParamDictPrivate *)0x0) goto LAB_002b98df;
      LOCK();
      (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
      UNLOCK();
      if ((pd.d)->params[0].type != 0) goto LAB_002b98df;
      if (local_c0 != (Allocator *)0x0) {
        (*local_c0->_vptr_Allocator[3])();
        goto LAB_002b98df;
      }
    }
    else {
      if ((_h & 3) != 0) goto LAB_002b9266;
      Mat::reshape((Mat *)&pd,this_00,iVar24,_h,(Allocator *)0x0);
      Mat::create(&this->weight_data_tm,iVar24,(int)_h >> 2,0x10,4,(Allocator *)0x0);
      lVar26 = 1;
      lVar37 = 2;
      lVar29 = 3;
      lVar27 = 0;
      for (uVar30 = 0; (long)(uVar30 | 3) < (long)uVar38; uVar30 = uVar30 + 4) {
        lVar32 = (long)(this->weight_data_tm).w;
        pvVar15 = (this->weight_data_tm).data;
        sVar17 = (this->weight_data_tm).elemsize;
        puVar31 = (undefined4 *)((uVar30 >> 2) * lVar32 * sVar17 + (long)pvVar15);
        lVar35 = (long)local_b4;
        lVar32 = sVar17 * lVar27 * lVar32;
        lVar33 = local_d0 * uVar30 * lVar35;
        lVar34 = local_d0 * lVar26 * lVar35;
        lVar28 = local_d0 * lVar37 * lVar35;
        lVar35 = local_d0 * lVar29 * lVar35;
        lVar39 = 0;
        lVar36 = 0;
        for (iVar23 = 0; iVar23 + 3 < iVar24; iVar23 = iVar23 + 4) {
          auVar2 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar36 + lVar33);
          auVar3 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar36 + lVar34);
          auVar4 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar36 + lVar28);
          auVar5 = *(undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar36 + lVar35);
          auVar19 = vunpcklps_avx(auVar2,auVar3);
          auVar20 = vunpcklps_avx(auVar4,auVar5);
          auVar18 = vunpckhps_avx(auVar2,auVar3);
          auVar5 = vunpckhps_avx(auVar4,auVar5);
          auVar2 = vmovlhps_avx(auVar19,auVar20);
          auVar4 = vunpckhpd_avx(auVar19,auVar20);
          auVar3 = vmovlhps_avx(auVar18,auVar5);
          auVar5 = vunpckhpd_avx(auVar18,auVar5);
          *(undefined1 (*) [16])((long)pvVar15 + lVar36 * 4 + lVar32) = auVar2;
          *(undefined1 (*) [16])((long)pvVar15 + lVar36 * 4 + lVar32 + 0x10) = auVar4;
          *(undefined1 (*) [16])((long)pvVar15 + lVar36 * 4 + lVar32 + 0x20) = auVar3;
          *(undefined1 (*) [16])((long)pvVar15 + lVar36 * 4 + lVar32 + 0x30) = auVar5;
          puVar31 = puVar31 + 0x10;
          lVar36 = lVar36 + 0x10;
          lVar39 = lVar39 + 4;
        }
        for (; (int)lVar39 < iVar24; lVar39 = lVar39 + 1) {
          *puVar31 = *(undefined4 *)((long)pd._vptr_ParamDict + lVar39 * 4 + lVar33);
          puVar31[1] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar39 * 4 + lVar34);
          puVar31[2] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar39 * 4 + lVar28);
          puVar31[3] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar39 * 4 + lVar35);
          puVar31 = puVar31 + 4;
        }
        lVar27 = lVar27 + 1;
        lVar26 = lVar26 + 4;
        lVar37 = lVar37 + 4;
        lVar29 = lVar29 + 4;
      }
      if (pd.d == (ParamDictPrivate *)0x0) goto LAB_002b98df;
      LOCK();
      (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
      UNLOCK();
      if ((pd.d)->params[0].type != 0) goto LAB_002b98df;
      if (local_c0 != (Allocator *)0x0) {
        (*local_c0->_vptr_Allocator[3])();
        goto LAB_002b98df;
      }
    }
    free(pd._vptr_ParamDict);
  }
  else {
LAB_002b9266:
    piVar14 = (this->super_InnerProduct).weight_data.refcount;
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + 1;
      UNLOCK();
    }
    piVar14 = (this->weight_data_tm).refcount;
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        pvVar15 = (this->weight_data_tm).data;
        pAVar16 = (this->weight_data_tm).allocator;
        if (pAVar16 == (Allocator *)0x0) {
          free(pvVar15);
        }
        else {
          (*pAVar16->_vptr_Allocator[3])(pAVar16,pvVar15,(long)iVar23 % (long)(int)_h & 0xffffffff);
        }
      }
    }
    piVar14 = (this->super_InnerProduct).weight_data.refcount;
    (this->weight_data_tm).data = (this->super_InnerProduct).weight_data.data;
    (this->weight_data_tm).refcount = piVar14;
    (this->weight_data_tm).elemsize = (this->super_InnerProduct).weight_data.elemsize;
    (this->weight_data_tm).elempack = (this->super_InnerProduct).weight_data.elempack;
    (this->weight_data_tm).allocator = (this->super_InnerProduct).weight_data.allocator;
    iVar23 = (this->super_InnerProduct).weight_data.w;
    iVar24 = (this->super_InnerProduct).weight_data.h;
    iVar22 = (this->super_InnerProduct).weight_data.d;
    (this->weight_data_tm).dims = (this->super_InnerProduct).weight_data.dims;
    (this->weight_data_tm).w = iVar23;
    (this->weight_data_tm).h = iVar24;
    (this->weight_data_tm).d = iVar22;
    (this->weight_data_tm).c = (this->super_InnerProduct).weight_data.c;
    (this->weight_data_tm).cstep = (this->super_InnerProduct).weight_data.cstep;
  }
LAB_002b98df:
  if (opt->lightmode == true) {
    piVar14 = (this->super_InnerProduct).weight_data.refcount;
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        pAVar16 = (this->super_InnerProduct).weight_data.allocator;
        if (pAVar16 == (Allocator *)0x0) {
          free((this->super_InnerProduct).weight_data.data);
        }
        else {
          (*pAVar16->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_InnerProduct).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_InnerProduct).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_InnerProduct).weight_data.elemsize + 4) = 0;
    this_00->data = (void *)0x0;
    (this->super_InnerProduct).weight_data.refcount = (int *)0x0;
    (this->super_InnerProduct).weight_data.dims = 0;
    (this->super_InnerProduct).weight_data.w = 0;
    (this->super_InnerProduct).weight_data.h = 0;
    (this->super_InnerProduct).weight_data.d = 0;
    (this->super_InnerProduct).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_fma::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer_cpu(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}